

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O3

uint8_t * icu_63::expandGroupLengths(uint8_t *s,uint16_t *offsets,uint16_t *lengths)

{
  ushort uVar1;
  ushort uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  byte bVar5;
  
  uVar2 = 0;
  uVar4 = 0;
  uVar1 = 0;
  do {
    bVar5 = *s;
    if (uVar2 < 0xc) {
      if (bVar5 < 0xc0) {
        uVar3 = (uint16_t)(bVar5 >> 4);
        goto LAB_002f0f62;
      }
      bVar5 = (bVar5 & 0x3f) + 0xc;
      *offsets = uVar4;
      offsets = offsets + 1;
      *lengths = (ushort)bVar5;
      lengths = lengths + 1;
      uVar4 = uVar4 + bVar5;
      uVar1 = uVar1 + 1;
      uVar2 = 0;
    }
    else {
      uVar3 = (uVar2 & 3) * 0x10 + (ushort)(bVar5 >> 4) + 0xc;
LAB_002f0f62:
      *offsets = uVar4;
      *lengths = uVar3;
      uVar4 = uVar3 + uVar4;
      uVar2 = bVar5 & 0xf;
      if ((bVar5 & 0xf) < 0xc) {
        offsets[1] = uVar4;
        offsets = offsets + 2;
        lengths[1] = uVar2;
        lengths = lengths + 2;
        uVar4 = uVar2 + uVar4;
        uVar1 = uVar1 + 2;
      }
      else {
        offsets = offsets + 1;
        lengths = lengths + 1;
        uVar1 = uVar1 + 1;
      }
    }
    s = s + 1;
    if (0x1f < uVar1) {
      return s;
    }
  } while( true );
}

Assistant:

static const uint8_t *
expandGroupLengths(const uint8_t *s,
                   uint16_t offsets[LINES_PER_GROUP+1], uint16_t lengths[LINES_PER_GROUP+1]) {
    /* read the lengths of the 32 strings in this group and get each string's offset */
    uint16_t i=0, offset=0, length=0;
    uint8_t lengthByte;

    /* all 32 lengths must be read to get the offset of the first group string */
    while(i<LINES_PER_GROUP) {
        lengthByte=*s++;

        /* read even nibble - MSBs of lengthByte */
        if(length>=12) {
            /* double-nibble length spread across two bytes */
            length=(uint16_t)(((length&0x3)<<4|lengthByte>>4)+12);
            lengthByte&=0xf;
        } else if((lengthByte /* &0xf0 */)>=0xc0) {
            /* double-nibble length spread across this one byte */
            length=(uint16_t)((lengthByte&0x3f)+12);
        } else {
            /* single-nibble length in MSBs */
            length=(uint16_t)(lengthByte>>4);
            lengthByte&=0xf;
        }

        *offsets++=offset;
        *lengths++=length;

        offset+=length;
        ++i;

        /* read odd nibble - LSBs of lengthByte */
        if((lengthByte&0xf0)==0) {
            /* this nibble was not consumed for a double-nibble length above */
            length=lengthByte;
            if(length<12) {
                /* single-nibble length in LSBs */
                *offsets++=offset;
                *lengths++=length;

                offset+=length;
                ++i;
            }
        } else {
            length=0;   /* prevent double-nibble detection in the next iteration */
        }
    }

    /* now, s is at the first group string */
    return s;
}